

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::GetAddressesFromMultisigRequest::ConvertFromStruct
          (GetAddressesFromMultisigRequest *this,GetAddressesFromMultisigRequestStruct *data)

{
  GetAddressesFromMultisigRequestStruct *data_local;
  GetAddressesFromMultisigRequest *this_local;
  
  this->is_elements_ = (bool)(data->is_elements & 1);
  std::__cxx11::string::operator=((string *)&this->redeem_script_,(string *)&data->redeem_script);
  std::__cxx11::string::operator=((string *)&this->network_,(string *)&data->network);
  std::__cxx11::string::operator=((string *)&this->hash_type_,(string *)&data->hash_type);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void GetAddressesFromMultisigRequest::ConvertFromStruct(
    const GetAddressesFromMultisigRequestStruct& data) {
  is_elements_ = data.is_elements;
  redeem_script_ = data.redeem_script;
  network_ = data.network;
  hash_type_ = data.hash_type;
  ignore_items = data.ignore_items;
}